

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowlev2.c
# Opt level: O0

LispPTR N_OP_putbasebyte(LispPTR base_addr,LispPTR byteoffset,LispPTR tos)

{
  DLword *pDVar1;
  uint local_14;
  LispPTR tos_local;
  LispPTR byteoffset_local;
  LispPTR base_addr_local;
  
  if (((tos & 0xfff0000) == 0xe0000) && ((tos & 0xffff) < 0x100)) {
    if ((byteoffset & 0xfff0000) == 0xe0000) {
      local_14 = byteoffset & 0xffff;
    }
    else {
      if ((byteoffset & 0xfff0000) != 0xf0000) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      local_14 = byteoffset | 0xffff0000;
    }
    pDVar1 = NativeAligned2FromLAddr(base_addr & 0xfffffff);
    *(char *)((long)pDVar1 + (ulong)local_14 ^ 3) = (char)tos;
    byteoffset_local = tos;
  }
  else {
    MachineState.errorexit = 1;
    byteoffset_local = 0xffffffff;
    MachineState.tosvalue = tos;
  }
  return byteoffset_local;
}

Assistant:

LispPTR N_OP_putbasebyte(LispPTR base_addr, LispPTR byteoffset, LispPTR tos) {
  if (((SEGMASK & tos) != S_POSITIVE) || ((unsigned short)tos >= 256)) ERROR_EXIT(tos);
  switch ((SEGMASK & byteoffset)) {
    case S_POSITIVE: byteoffset &= 0x0000FFFF; break;
    case S_NEGATIVE: byteoffset |= 0xFFFF0000; break;
    default:
      /* ucode and ufn don't handle displacement not smallp */
      ERROR_EXIT(tos);
  } /* end switch */
  GETBYTE(((char *)NativeAligned2FromLAddr(POINTERMASK & base_addr)) + byteoffset) = 0xFF & tos;
  return (tos);
}